

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::PrettyUnitTestResultPrinter::PrintFailedTests(UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  TestSuite *this;
  TestInfo *this_00;
  TestResult *this_01;
  char *pcVar4;
  char *pcVar5;
  int test_count;
  TestInfo *test_info;
  int j;
  TestSuite *test_suite;
  int i;
  string local_38;
  uint local_14;
  UnitTest *pUStack_10;
  int failed_test_count;
  UnitTest *unit_test_local;
  
  pUStack_10 = unit_test;
  local_14 = UnitTest::failed_test_count(unit_test);
  ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
  FormatTestCount_abi_cxx11_(&local_38,(testing *)(ulong)local_14,test_count);
  uVar3 = std::__cxx11::string::c_str();
  printf("%s, listed below:\n",uVar3);
  std::__cxx11::string::~string((string *)&local_38);
  for (test_suite._0_4_ = 0; iVar2 = UnitTest::total_test_suite_count(pUStack_10),
      (int)test_suite < iVar2; test_suite._0_4_ = (int)test_suite + 1) {
    this = UnitTest::GetTestSuite(pUStack_10,(int)test_suite);
    bVar1 = TestSuite::should_run(this);
    if ((bVar1) && (iVar2 = TestSuite::failed_test_count(this), iVar2 != 0)) {
      for (test_info._4_4_ = 0; iVar2 = TestSuite::total_test_count(this), test_info._4_4_ < iVar2;
          test_info._4_4_ = test_info._4_4_ + 1) {
        this_00 = TestSuite::GetTestInfo(this,test_info._4_4_);
        bVar1 = TestInfo::should_run(this_00);
        if (bVar1) {
          this_01 = TestInfo::result(this_00);
          bVar1 = TestResult::Failed(this_01);
          if (bVar1) {
            ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
            pcVar4 = TestSuite::name(this);
            pcVar5 = TestInfo::name(this_00);
            printf("%s.%s",pcVar4,pcVar5);
            PrintFullTestCommentIfPresent(this_00);
            printf("\n");
          }
        }
      }
    }
  }
  pcVar4 = "TESTS";
  if (local_14 == 1) {
    pcVar4 = "TEST";
  }
  printf("\n%2d FAILED %s\n",(ulong)local_14,pcVar4);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::PrintFailedTests(const UnitTest& unit_test) {
  const int failed_test_count = unit_test.failed_test_count();
  ColoredPrintf(COLOR_RED,  "[  FAILED  ] ");
  printf("%s, listed below:\n", FormatTestCount(failed_test_count).c_str());

  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    const TestSuite& test_suite = *unit_test.GetTestSuite(i);
    if (!test_suite.should_run() || (test_suite.failed_test_count() == 0)) {
      continue;
    }
    for (int j = 0; j < test_suite.total_test_count(); ++j) {
      const TestInfo& test_info = *test_suite.GetTestInfo(j);
      if (!test_info.should_run() || !test_info.result()->Failed()) {
        continue;
      }
      ColoredPrintf(COLOR_RED, "[  FAILED  ] ");
      printf("%s.%s", test_suite.name(), test_info.name());
      PrintFullTestCommentIfPresent(test_info);
      printf("\n");
    }
  }
  printf("\n%2d FAILED %s\n", failed_test_count,
         failed_test_count == 1 ? "TEST" : "TESTS");
}